

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::draw_coordinates(Application *this)

{
  int iVar1;
  int x;
  int iVar2;
  bool bVar3;
  
  glDisable(0xb71);
  glDisable(0xb50);
  glEnable(0xbe2);
  glBlendFunc(0x302,1);
  glLineWidth(0x40000000);
  glBegin(1);
  glColor4f(0x3f800000,0,0,0x3f000000);
  iVar2 = 0;
  glVertex3i(0,0,0);
  glVertex3i(1,0,0);
  glColor4f(0,0x3f800000,0,0x3f000000);
  glVertex3i(0,0,0);
  glVertex3i(0,1,0);
  glColor4f(0,0,0x3f800000,0x3f000000);
  glVertex3i(0,0,0);
  glVertex3i(0,0,1);
  glColor4f(0x3f000000,0x3f000000,0x3f000000,0x3f000000);
  iVar1 = 9;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    glVertex3i(iVar2 + -4,0,0xfffffffc);
    glVertex3i(iVar2 + -4,0,4);
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  iVar1 = 9;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    glVertex3i(0xfffffffc,0,iVar2 + -4);
    glVertex3i(4,0,iVar2 + -4);
    iVar2 = iVar2 + 1;
  }
  glEnd();
  glEnable(0xb50);
  glEnable(0xb71);
  return;
}

Assistant:

void Application::draw_coordinates() {

  glDisable(GL_DEPTH_TEST);
  glDisable(GL_LIGHTING);
  glEnable( GL_BLEND );
  glBlendFunc( GL_SRC_ALPHA, GL_ONE );
  glLineWidth( 2. );

  glBegin(GL_LINES);
  glColor4f(1.0f, 0.0f, 0.0f, 0.5f);
  glVertex3i(0,0,0);
  glVertex3i(1,0,0);

  glColor4f(0.0f, 1.0f, 0.0f, 0.5f);
  glVertex3i(0,0,0);
  glVertex3i(0,1,0);

  glColor4f(0.0f, 0.0f, 1.0f, 0.5f);
  glVertex3i(0,0,0);
  glVertex3i(0,0,1);

  glColor4f(0.5f, 0.5f, 0.5f, 0.5f);
  for (int x = 0; x <= 8; ++x) {
    glVertex3i(x - 4, 0, -4);
    glVertex3i(x - 4, 0,  4);
  }
  for (int z = 0; z <= 8; ++z) {
    glVertex3i(-4, 0, z - 4);
    glVertex3i( 4, 0, z - 4);
  }
  glEnd();

  glEnable(GL_LIGHTING);
  glEnable(GL_DEPTH_TEST);

}